

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  ImGuiTabItem *pIVar1;
  undefined1 local_58 [8];
  ImGuiTabItem new_tab;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiTabItemFlags tab_flags_local;
  ImGuiTabBar *tab_bar_local;
  
  new_tab._40_8_ = GImGui;
  pIVar1 = TabBarFindTabByID(tab_bar,window->ID);
  if (pIVar1 != (ImGuiTabItem *)0x0) {
    __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1c6e,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  if (*(ImGuiTabBar **)(new_tab._40_8_ + 0x1f98) != tab_bar) {
    ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)local_58);
    local_58._0_4_ = window->ID;
    new_tab.Window._0_4_ = tab_bar->CurrFrameVisible;
    if ((int)new_tab.Window == -1) {
      new_tab.Window._0_4_ = *(int *)(new_tab._40_8_ + 0x1b18) + -1;
    }
    local_58._4_4_ = tab_flags;
    new_tab._0_8_ = window;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)local_58);
    return;
  }
  __assert_fail("g.CurrentTabBar != tab_bar",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                ,0x1c6f,"void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)")
  ;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}